

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_build_polygon_boundaries.cc
# Opt level: O3

void s2shapeutil::BuildPolygonBoundaries
               (vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                *components,
               vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
               *polygons)

{
  Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
  *pSVar1;
  S2Shape *pSVar2;
  void *pvVar3;
  long *plVar4;
  key_type pSVar5;
  ostream *poVar6;
  key_type pSVar7;
  bool bVar8;
  int iVar9;
  vector<S2Shape*,std::allocator<S2Shape*>> *pvVar10;
  mapped_type *__x;
  S2Shape **ppSVar11;
  long *plVar12;
  pointer pvVar13;
  long lVar14;
  size_type __n;
  iterator iVar15;
  ulong uVar16;
  key_type pSVar17;
  long lVar18;
  Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
  *pSVar19;
  const_iterator cVar20;
  iterator iVar21;
  iterator iVar22;
  S2Shape *loop_1;
  vector<S2Shape_*,_std::allocator<S2Shape_*>_> outer_loops;
  vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
  ancestors;
  vector<int,_std::allocator<int>_> component_ids;
  S2Shape *ancestor;
  btree_map<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256>
  children;
  S2ContainsPointQuery<MutableS2ShapeIndex> contains_query;
  MutableS2ShapeIndex index;
  vector<S2Shape_*,_std::allocator<S2Shape_*>_> local_198;
  _Head_base<0UL,_S2Shape_*,_false> local_180;
  S2Shape **local_178;
  iterator iStack_170;
  S2Shape **local_168;
  vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
  *local_158;
  vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
  local_150;
  void *local_138;
  iterator iStack_130;
  int *local_128;
  key_type local_120;
  btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
  local_118 [2];
  undefined1 local_e8 [8];
  ostream *poStack_e0;
  _func_int **local_d8;
  S2CellId local_d0;
  atomic<const_S2ShapeIndexCell_*> local_c8;
  MutableS2ShapeIndex *local_c0;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *local_b8;
  int local_b0;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *local_a8;
  int local_a0;
  vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
  *local_90;
  MutableS2ShapeIndex local_88;
  
  local_158 = polygons;
  std::
  vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
  ::clear(polygons);
  if ((components->
      super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (components->
      super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    MutableS2ShapeIndex::MutableS2ShapeIndex(&local_88);
    local_128 = (int *)0x0;
    local_138 = (void *)0x0;
    iStack_130._M_current = (int *)0x0;
    local_168 = (S2Shape **)0x0;
    local_178 = (S2Shape **)0x0;
    iStack_170._M_current = (S2Shape **)0x0;
    local_150.
    super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    pvVar13 = (components->
              super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((components->
        super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish == pvVar13) {
      __n = 0;
    }
    else {
      ppSVar11 = (S2Shape **)0x0;
      iVar15._M_current = (S2Shape **)0x0;
      uVar16 = 0;
      local_90 = components;
      do {
        pSVar19 = (Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
                   *)pvVar13[uVar16].super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        pSVar1 = (Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
                  *)pvVar13[uVar16].super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        if (pSVar19 != pSVar1) {
          do {
            local_118[0].root_.
            super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
            .
            super_Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
            .value = (CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                      )pSVar19->value;
            if ((ulong)((long)pvVar13[uVar16].
                              super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)pvVar13[uVar16].
                             super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
                             super__Vector_impl_data._M_start) < 9) {
LAB_00221515:
              if (iStack_170._M_current == local_168) {
                std::vector<S2Shape*,std::allocator<S2Shape*>>::_M_realloc_insert<S2Shape*const&>
                          ((vector<S2Shape*,std::allocator<S2Shape*>> *)&local_178,iStack_170,
                           (S2Shape **)local_118);
              }
              else {
                *iStack_170._M_current =
                     (S2Shape *)
                     local_118[0].root_.
                     super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                     .
                     super_Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
                     .value;
                iStack_170._M_current = iStack_170._M_current + 1;
              }
            }
            else {
              local_e8 = (undefined1  [8])0xbf847a99aa86ed3b;
              poStack_e0 = (ostream *)0x3f653cc5488bec88;
              local_d8 = (_func_int **)0x3fefff901a72d2ac;
              bVar8 = ContainsBruteForce((S2Shape *)
                                         local_118[0].root_.
                                         super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                                         .
                                         super_Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
                                         .value,(S2Point *)local_e8);
              if (bVar8) goto LAB_00221515;
              local_180._M_head_impl =
                   (S2Shape *)
                   local_118[0].root_.
                   super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                   .
                   super_Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
                   .value;
              MutableS2ShapeIndex::Add
                        (&local_88,(unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_180)
              ;
              if (local_180._M_head_impl != (S2Shape *)0x0) {
                (*(local_180._M_head_impl)->_vptr_S2Shape[1])();
              }
              local_180._M_head_impl = (S2Shape *)0x0;
              if (iStack_130._M_current == local_128) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_138,iStack_130,
                           (int *)&local_150);
              }
              else {
                *iStack_130._M_current =
                     (int)local_150.
                          super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iStack_130._M_current = iStack_130._M_current + 1;
              }
            }
            pSVar19 = pSVar19 + 1;
            ppSVar11 = local_178;
            iVar15._M_current = iStack_170._M_current;
            components = local_90;
          } while (pSVar19 != pSVar1);
        }
        iVar9 = (int)local_150.
                     super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1;
        uVar16 = (ulong)iVar9;
        if ((long)iVar15._M_current - (long)ppSVar11 >> 3 != uVar16) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)local_e8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_build_polygon_boundaries.cc"
                     ,0x4b,kFatal,(ostream *)&std::cerr);
          poVar6 = poStack_e0;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poStack_e0,"Check failed: (i + 1) == (outer_loops.size()) ",0x2e);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"Component is not a subdivision",0x1e);
          goto LAB_00221b0d;
        }
        pvVar13 = (components->
                  super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        __n = ((long)(components->
                     super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13 >> 3) *
              -0x5555555555555555;
        local_150.
        super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar9;
      } while (uVar16 <= __n && __n - uVar16 != 0);
    }
    std::
    vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
    ::vector(&local_150,__n,(allocator_type *)local_e8);
    local_c0 = &local_88;
    poStack_e0 = (ostream *)CONCAT44(poStack_e0._4_4_,1);
    local_d0.id_ = 0xffffffffffffffff;
    local_c8._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_d8 = (_func_int **)&PTR__IteratorBase_002bb190;
    local_b8 = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                *)0x0;
    local_b0 = -1;
    local_a8 = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                *)0x0;
    local_a0 = -1;
    local_e8 = (undefined1  [8])local_c0;
    if (local_88.index_status_._M_i != FRESH) {
      MutableS2ShapeIndex::ApplyUpdatesThreadSafe(&local_88);
    }
    cVar20 = gtl::internal_btree::
             btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
             ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                    *)&local_88.cell_map_);
    local_b8 = cVar20.node;
    local_b0 = cVar20.position;
    local_d0.id_ = 0xffffffffffffffff;
    local_c8._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_a8 = local_b8;
    local_a0 = local_b0;
    if (iStack_170._M_current == local_178) {
      local_118[0].root_.
      super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
      .
      super_Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
      .value = (CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                )(Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
                  )0x0;
      local_118[0].rightmost_ = (node_type *)0x0;
      local_118[0].size_ = 0;
    }
    else {
      lVar14 = 0;
      uVar16 = 0;
      do {
        pSVar2 = local_178[uVar16];
        iVar9 = (*pSVar2->_vptr_S2Shape[2])(pSVar2);
        if (iVar9 < 1) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)local_118,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_build_polygon_boundaries.cc"
                     ,0x52,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_118[0].rightmost_,"Check failed: (loop->num_edges()) > (0) ",
                     0x28);
          goto LAB_00221b0d;
        }
        (*pSVar2->_vptr_S2Shape[3])(local_118,pSVar2,0);
        S2ContainsPointQuery<MutableS2ShapeIndex>::GetContainingShapes
                  (&local_198,(S2ContainsPointQuery<MutableS2ShapeIndex> *)local_e8,
                   (S2Point *)local_118);
        lVar18 = CONCAT44(local_150.
                          super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                          (int)local_150.
                               super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        pvVar3 = *(void **)(lVar18 + lVar14);
        *(undefined8 *)(lVar18 + lVar14) =
             local_198.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        ((undefined8 *)(lVar18 + lVar14))[1] =
             local_198.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        *(pointer *)(lVar18 + 0x10 + lVar14) =
             local_198.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_198.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_198.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_198.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((pvVar3 != (void *)0x0) &&
           (operator_delete(pvVar3),
           local_198.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
           super__Vector_impl_data._M_start != (pointer)0x0)) {
          operator_delete(local_198.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        uVar16 = uVar16 + 1;
        lVar14 = lVar14 + 0x18;
      } while (uVar16 < (ulong)((long)iStack_170._M_current - (long)local_178 >> 3));
      local_118[0].root_.
      super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
      .
      super_Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
      .value = (CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                )(Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
                  )0x0;
      local_118[0].rightmost_ = (node_type *)0x0;
      local_118[0].size_ = 0;
      if (iStack_170._M_current != local_178) {
        uVar16 = 0;
        do {
          local_120 = (key_type)0x0;
          lVar14 = CONCAT44(local_150.
                            super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (int)local_150.
                                 super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
          plVar12 = *(long **)(lVar14 + uVar16 * 0x18);
          plVar4 = *(long **)(lVar14 + 8 + uVar16 * 0x18);
          iVar9 = (int)((long)plVar4 - (long)plVar12 >> 3);
          if (0 < iVar9) {
            if (plVar12 == plVar4) {
LAB_00221bac:
              S2LogMessage::S2LogMessage
                        ((S2LogMessage *)&local_198,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_build_polygon_boundaries.cc"
                         ,0x62,kFatal,(ostream *)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         local_198.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl
                         .super__Vector_impl_data._M_finish,"Check failed: ancestor != nullptr ",
                         0x22);
LAB_00221b0d:
              abort();
            }
            pSVar17 = (key_type)0x0;
            do {
              pSVar5 = (key_type)*plVar12;
              lVar18 = (long)*(int *)((long)local_138 + (long)pSVar5->id_ * 4);
              pSVar7 = local_120;
              if ((*(long *)(lVar14 + 8 + lVar18 * 0x18) - *(long *)(lVar14 + lVar18 * 0x18) >> 3 ==
                   (ulong)(iVar9 - 1)) &&
                 (bVar8 = pSVar17 != (key_type)0x0, pSVar17 = pSVar5, pSVar7 = pSVar5, bVar8)) {
                S2LogMessage::S2LogMessage
                          ((S2LogMessage *)&local_198,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_build_polygon_boundaries.cc"
                           ,0x5e,kFatal,(ostream *)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)
                           local_198.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish,
                           "Check failed: ancestor == nullptr ",0x22);
                goto LAB_00221b0d;
              }
              local_120 = pSVar7;
              plVar12 = plVar12 + 1;
            } while (plVar12 != plVar4);
            if (pSVar17 == (key_type)0x0) goto LAB_00221bac;
          }
          pvVar10 = (vector<S2Shape*,std::allocator<S2Shape*>> *)
                    gtl::internal_btree::
                    btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                    ::operator[]((btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                                  *)local_118,&local_120);
          iVar15._M_current = *(S2Shape ***)(pvVar10 + 8);
          if (iVar15._M_current == *(S2Shape ***)(pvVar10 + 0x10)) {
            std::vector<S2Shape*,std::allocator<S2Shape*>>::_M_realloc_insert<S2Shape*const&>
                      (pvVar10,iVar15,local_178 + uVar16);
          }
          else {
            *iVar15._M_current = local_178[uVar16];
            *(long *)(pvVar10 + 8) = *(long *)(pvVar10 + 8) + 8;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < (ulong)((long)iStack_170._M_current - (long)local_178 >> 3));
      }
    }
    std::
    vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
    ::resize(local_158,
             ((long)local_88.shapes_.
                    super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_88.shapes_.
                   super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) * 0x20000000 + 0x100000000 >> 0x20);
    if (0 < (int)((ulong)((long)local_88.shapes_.
                                super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_88.shapes_.
                               super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      lVar14 = 0;
      lVar18 = 0;
      do {
        pvVar13 = (local_158->
                  super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_198.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)local_88.shapes_.
                      super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar18]._M_t.
                      super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t.
                      super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                      super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl;
        iVar21 = gtl::internal_btree::
                 btree<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>
                 ::find_unique<S2Shape*>
                           ((btree<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>
                             *)local_118,(S2Shape **)&local_198);
        iVar22 = gtl::internal_btree::
                 btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
                 ::end(local_118);
        pvVar10 = (vector<S2Shape*,std::allocator<S2Shape*>> *)
                  ((long)&(pvVar13->super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>).
                          _M_impl.super__Vector_impl_data._M_start + lVar14);
        if (iVar21.position != iVar22.position || iVar21.node != iVar22.node) {
          if (((undefined1  [16])iVar21 & (undefined1  [16])0x7) != (undefined1  [16])0x0) {
            __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                          ,0x1e1,
                          "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2Shape *, std::vector<S2Shape *>>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2Shape *, std::vector<S2Shape *>>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
                         );
          }
          std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::operator=
                    ((vector<S2Shape_*,_std::allocator<S2Shape_*>_> *)pvVar10,
                     (vector<S2Shape_*,_std::allocator<S2Shape_*>_> *)
                     (iVar21.node + (long)iVar21.position * 0x20 + 0x18));
        }
        iVar15._M_current =
             *(S2Shape ***)
              ((long)&(pvVar13->super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish + lVar14);
        if (iVar15._M_current ==
            *(S2Shape ***)
             ((long)&(pvVar13->super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>)._M_impl.
                     super__Vector_impl_data._M_end_of_storage + lVar14)) {
          std::vector<S2Shape*,std::allocator<S2Shape*>>::_M_realloc_insert<S2Shape*const&>
                    (pvVar10,iVar15,(S2Shape **)&local_198);
        }
        else {
          *iVar15._M_current =
               (S2Shape *)
               local_198.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
               super__Vector_impl_data._M_start;
          plVar12 = (long *)((long)&(pvVar13->
                                    super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>).
                                    _M_impl.super__Vector_impl_data._M_finish + lVar14);
          *plVar12 = *plVar12 + 8;
        }
        lVar18 = lVar18 + 1;
        lVar14 = lVar14 + 0x18;
      } while (lVar18 < (int)((ulong)((long)local_88.shapes_.
                                            super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_88.shapes_.
                                           super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3));
    }
    local_198.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    __x = gtl::internal_btree::
          btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
          ::operator[]((btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                        *)local_118,(key_type *)&local_198);
    std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::operator=
              ((local_158->
               super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish + -1,__x);
    MutableS2ShapeIndex::ReleaseAll
              ((vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                *)&local_198,&local_88);
    if (local_198.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_198.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      memset(local_198.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
             super__Vector_impl_data._M_start,0,
             ((long)local_198.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
                    super__Vector_impl_data._M_finish +
              (-8 - (long)local_198.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>.
                          _M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff8U) + 8);
    }
    std::
    vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
    ::~vector((vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
               *)&local_198);
    gtl::internal_btree::
    btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
    ::~btree(local_118);
    std::
    vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
    ::~vector(&local_150);
    if (local_178 != (S2Shape **)0x0) {
      operator_delete(local_178);
    }
    if (local_138 != (void *)0x0) {
      operator_delete(local_138);
    }
    MutableS2ShapeIndex::~MutableS2ShapeIndex(&local_88);
  }
  return;
}

Assistant:

void BuildPolygonBoundaries(const vector<vector<S2Shape*>>& components,
                            vector<vector<S2Shape*>>* polygons) {
  polygons->clear();
  if (components.empty()) return;

  // Since the loop boundaries do not cross, a loop nesting hierarchy can be
  // defined by choosing any point on the sphere as the "point at infinity".
  // Loop A then contains loop B if (1) A contains the boundary of B and (2)
  // loop A does not contain the point at infinity.
  //
  // We choose S2::Origin() for this purpose.  The loop nesting hierarchy then
  // determines the face structure.  Here are the details:
  //
  // 1. Build an S2ShapeIndex of all loops that do not contain S2::Origin().
  //    This leaves at most one unindexed loop per connected component
  //    (the "outer loop").
  //
  // 2. For each component, choose a representative vertex and determine
  //    which indexed loops contain it.  The "depth" of this component is
  //    defined as the number of such loops.
  //
  // 3. Assign the outer loop of each component to the containing loop whose
  //    depth is one less.  This generates a set of multi-loop polygons.
  //
  // 4. The outer loops of all components at depth 0 become a single face.

  MutableS2ShapeIndex index;
  // A map from shape.id() to the corresponding component number.
  vector<int> component_ids;
  vector<S2Shape*> outer_loops;
  for (int i = 0; i < components.size(); ++i) {
    const auto& component = components[i];
    for (S2Shape* loop : component) {
      if (component.size() > 1 &&
          !s2shapeutil::ContainsBruteForce(*loop, S2::Origin())) {
        // Ownership is transferred back at the end of this function.
        index.Add(WrapUnique(loop));
        component_ids.push_back(i);
      } else {
        outer_loops.push_back(loop);
      }
    }
    // Check that there is exactly one outer loop in each component.
    S2_DCHECK_EQ(i + 1, outer_loops.size()) << "Component is not a subdivision";
  }
  // Find the loops containing each component.
  vector<vector<S2Shape*>> ancestors(components.size());
  auto contains_query = MakeS2ContainsPointQuery(&index);
  for (int i = 0; i < outer_loops.size(); ++i) {
    auto loop = outer_loops[i];
    S2_DCHECK_GT(loop->num_edges(), 0);
    ancestors[i] = contains_query.GetContainingShapes(loop->edge(0).v0);
  }
  // Assign each outer loop to the component whose depth is one less.
  // Components at depth 0 become a single face.
  gtl::btree_map<S2Shape*, vector<S2Shape*>> children;
  for (int i = 0; i < outer_loops.size(); ++i) {
    S2Shape* ancestor = nullptr;
    int depth = ancestors[i].size();
    if (depth > 0) {
      for (auto candidate : ancestors[i]) {
        if (ancestors[component_ids[candidate->id()]].size() == depth - 1) {
          S2_DCHECK(ancestor == nullptr);
          ancestor = candidate;
        }
      }
      S2_DCHECK(ancestor != nullptr);
    }
    children[ancestor].push_back(outer_loops[i]);
  }
  // There is one face per loop that is not an outer loop, plus one for the
  // outer loops of components at depth 0.
  polygons->resize(index.num_shape_ids() + 1);
  for (int i = 0; i < index.num_shape_ids(); ++i) {
    auto polygon = &(*polygons)[i];
    auto loop = index.shape(i);
    auto itr = children.find(loop);
    if (itr != children.end()) {
      *polygon = itr->second;
    }
    polygon->push_back(loop);
  }
  polygons->back() = children[nullptr];

  // Explicitly release the shapes from the index so they are not deleted.
  for (auto& ptr : index.ReleaseAll()) ptr.release();
}